

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_scalar.c
# Opt level: O1

void glist_scalar(_glist *glist,t_symbol *classname,int argc,t_atom *argv)

{
  uint in_EAX;
  int natoms;
  t_symbol *ptVar1;
  t_template *ptVar2;
  _binbuf *x;
  t_atom *vec;
  int nextmsg;
  undefined8 uStack_28;
  
  uStack_28._0_4_ = in_EAX;
  ptVar1 = atom_getsymbolarg(0,argc,argv);
  ptVar1 = canvas_makebindsym(ptVar1);
  uStack_28 = (ulong)(uint)uStack_28;
  ptVar2 = template_findbyname(ptVar1);
  if (ptVar2 != (t_template *)0x0) {
    x = binbuf_new();
    binbuf_restore(x,argc,argv);
    natoms = binbuf_getnatom(x);
    vec = binbuf_getvec(x);
    canvas_readscalar(glist,natoms,vec,(int *)((long)&uStack_28 + 4),0);
    binbuf_free(x);
    return;
  }
  ptVar1 = atom_getsymbolarg(0,argc,argv);
  pd_error(glist,"%s: no such template",ptVar1->s_name);
  return;
}

Assistant:

void glist_scalar(t_glist *glist,
    t_symbol *classname, int argc, t_atom *argv)
{
    t_symbol *templatesym =
        canvas_makebindsym(atom_getsymbolarg(0, argc, argv));
    t_binbuf *b;
    int natoms, nextmsg = 0;
    t_atom *vec;
    if (!template_findbyname(templatesym))
    {
        pd_error(glist, "%s: no such template",
            atom_getsymbolarg(0, argc, argv)->s_name);
        return;
    }

    b = binbuf_new();
    binbuf_restore(b, argc, argv);
    natoms = binbuf_getnatom(b);
    vec = binbuf_getvec(b);
    canvas_readscalar(glist, natoms, vec, &nextmsg, 0);
    binbuf_free(b);
}